

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float3 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  undefined1 *puVar4;
  char *pcVar5;
  undefined1 *puVar6;
  size_type sVar7;
  size_type sVar8;
  undefined4 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  ostream *poVar15;
  long *plVar16;
  long *plVar17;
  const_iterator cVar18;
  mapped_type *pmVar19;
  _Base_ptr p_Var20;
  Property *args;
  size_type __n;
  undefined1 uVar21;
  size_t i;
  ulong uVar22;
  string *__v;
  pointer pcVar23;
  _Alloc_hider _Var24;
  long lVar25;
  anon_struct_8_0_00000001_for___align aVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  _Base_ptr p_Var28;
  bool bVar29;
  bool bVar30;
  ParseResult ret;
  string attr_type_name;
  optional<std::array<float,_3UL>_> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  Animatable<std::array<float,_3UL>_> dst;
  optional<tinyusdz::Animatable<std::array<float,_3UL>_>_> av;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9c8;
  bool local_629;
  undefined1 local_628 [8];
  _Alloc_hider local_620;
  undefined1 local_618 [8];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [24];
  string local_5d8;
  Property *local_5b8;
  AttrMetas *local_5b0;
  UsdPrimvarReader_float3 *local_5a8;
  undefined7 local_5a0;
  undefined1 uStack_599;
  undefined5 uStack_598;
  undefined2 uStack_593;
  undefined1 uStack_591;
  undefined5 uStack_590;
  undefined2 uStack_58b;
  undefined1 uStack_589;
  string *local_580;
  string *local_578;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_570;
  _Base_ptr local_568;
  optional<std::array<float,_3UL>_> local_560;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  undefined4 *local_500;
  undefined8 local_4f8;
  undefined4 local_4f0;
  undefined2 uStack_4ec;
  undefined1 uStack_4ea;
  undefined1 uStack_4e9;
  optional<tinyusdz::Animatable<std::array<float,3ul>>> *local_4e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_4d8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_4d0;
  string *local_4c8;
  _Base_ptr local_4c0;
  optional<std::array<float,_3UL>_> local_4b8;
  undefined1 local_4a8 [376];
  string local_330 [16];
  long local_320 [2];
  string local_310 [16];
  undefined8 local_300 [2];
  undefined1 local_2f0 [32];
  key_type local_2d0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [40];
  storage_t<tinyusdz::Token> sStack_268;
  pointer local_248;
  pointer pSStack_240;
  pointer local_238;
  _Base_ptr p_Stack_230;
  undefined1 local_228;
  pointer local_220;
  undefined1 local_218;
  optional<tinyusdz::Interpolation> local_210;
  optional<unsigned_int> oStack_208;
  undefined8 local_200;
  undefined1 auStack_1f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e0 [2];
  undefined1 local_1c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined8 uStack_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [32];
  _Alloc_hider local_150;
  undefined1 auStack_148 [32];
  optional<tinyusdz::Token> local_128;
  optional<tinyusdz::Interpolation> local_100;
  undefined1 auStack_f8 [56];
  undefined1 auStack_c0 [32];
  undefined1 local_a0 [32];
  storage_t<tinyusdz::Animatable<tinyusdz::Token>_> local_80 [8];
  undefined1 auStack_78 [56];
  bool bStack_40;
  undefined8 uStack_3f;
  
  local_550._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_550._M_impl.super__Rb_tree_header._M_header;
  local_550._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_550._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_550._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5a8 = preader;
  local_578 = warn;
  local_550._M_impl.super__Rb_tree_header._M_header._M_right =
       local_550._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_550,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT17(local_2a0._M_local_buf[7],
                             CONCAT16(local_2a0._M_local_buf[6],
                                      CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                               CONCAT22(local_2a0._M_allocated_capacity._2_2_,
                                                        local_2a0._M_allocated_capacity._0_2_)))) +
                    1);
  }
  p_Var20 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4c0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_629 = p_Var20 == local_4c0;
  if (!local_629) {
    local_5b0 = &(local_5a8->fallback)._metas;
    local_4d0 = &(local_5a8->fallback)._paths;
    local_4e0 = (optional<tinyusdz::Animatable<std::array<float,3ul>>> *)
                &(local_5a8->fallback)._attrib;
    local_570 = &local_5a8->varname;
    local_4c8 = (string *)&local_5a8->result;
    local_4d8 = &(local_5a8->super_ShaderNode).super_UsdShadePrim.props;
    local_580 = err;
    do {
      local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_520,*(long *)(p_Var20 + 1),
                 (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
      local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"inputs:fallback","");
      sVar8 = local_520._M_string_length;
      sVar7 = local_5d8._M_string_length;
      local_620._M_p = auStack_610;
      local_618 = (undefined1  [8])0x0;
      auStack_610._0_8_ = auStack_610._0_8_ & 0xffffffffffffff00;
      __n = local_520._M_string_length;
      if (local_5d8._M_string_length < local_520._M_string_length) {
        __n = local_5d8._M_string_length;
      }
      if (__n == 0) {
        bVar29 = true;
      }
      else {
        iVar13 = bcmp(local_520._M_dataplus._M_p,local_5d8._M_dataplus._M_p,__n);
        bVar29 = iVar13 == 0;
      }
      local_5b8 = (Property *)(p_Var20 + 2);
      if ((bool)(bVar29 ^ 1U | sVar8 != sVar7)) {
        local_628._0_4_ = 1;
      }
      else {
        if (((ulong)p_Var20[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_628._0_4_ = 7;
          puVar4 = local_4a8 + 0x10;
          local_4a8._0_4_ = SUB84(puVar4,0);
          local_4a8._4_2_ = (undefined2)((ulong)puVar4 >> 0x20);
          local_4a8._6_2_ = (undefined2)((ulong)puVar4 >> 0x30);
          local_600._0_8_ = &DAT_0000003e;
          pcVar14 = (char *)::std::__cxx11::string::_M_create((ulong *)local_4a8,(ulong)local_600);
          local_4a8._0_4_ = SUB84(pcVar14,0);
          local_4a8._4_2_ = (undefined2)((ulong)pcVar14 >> 0x20);
          local_4a8._6_2_ = (undefined2)((ulong)pcVar14 >> 0x30);
          local_4a8._16_8_ = local_600._0_8_;
          builtin_strncpy(pcVar14,"Property `{}` must be Attribute, but declared as Relationship.",
                          0x3e);
          local_4a8._8_4_ = (undefined4)local_600._0_8_;
          local_4a8._12_2_ = SUB82(local_600._0_8_,4);
          local_4a8._14_2_ = SUB82(local_600._0_8_,6);
          pcVar14[local_600._0_8_] = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_4a8,&local_5d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_600._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_620,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT17(local_2a0._M_local_buf[7],
                                     CONCAT16(local_2a0._M_local_buf[6],
                                              CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                       CONCAT22(local_2a0._M_allocated_capacity.
                                                                _2_2_,local_2a0.
                                                                      _M_allocated_capacity._0_2_)))
                                    ) + 1);
          }
          puVar4 = (undefined1 *)CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_))
          ;
          if (puVar4 != local_4a8 + 0x10) {
            operator_delete(puVar4,(ulong)(local_4a8._16_8_ + 1));
          }
        }
        if (p_Var20[6]._M_left != p_Var20[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4d0,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var20[6]._M_parent);
          local_628 = (undefined1  [8])((ulong)local_628 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_((string *)local_600,&local_5b8->_attrib);
        local_2b0._0_8_ = &local_2a0;
        local_2a0._M_allocated_capacity._4_2_ = 0x3374;
        local_2a0._M_allocated_capacity._0_2_ = 0x6c66;
        local_2a0._M_allocated_capacity._2_2_ = 0x616f;
        local_2b0._8_4_ = 6;
        local_2b0._12_2_ = 0;
        local_2b0._14_2_ = 0;
        local_2a0._M_local_buf[6] = '\0';
        if ((undefined1 *)local_600._8_8_ == (undefined1 *)0x6) {
          bVar29 = *(short *)(local_600._0_8_ + 4) == 0x3374 &&
                   *(int *)local_600._0_8_ == 0x616f6c66;
        }
        else {
          bVar29 = false;
        }
        bVar30 = true;
        if (!bVar29) {
          local_500 = &local_4f0;
          uStack_4ec = 0x3374;
          local_4f0 = 0x616f6c66;
          local_4f8 = 6;
          uStack_4ea = 0;
          if ((undefined1 *)local_600._8_8_ == (undefined1 *)0x6) {
            bVar30 = *(short *)(local_600._0_8_ + 4) == 0x3374 &&
                     *(int *)local_600._0_8_ == 0x616f6c66;
          }
          else {
            bVar30 = false;
          }
        }
        if ((!bVar29) && (local_500 != &local_4f0)) {
          operator_delete(local_500,
                          CONCAT17(uStack_4e9,CONCAT16(uStack_4ea,CONCAT24(uStack_4ec,local_4f0))) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._0_8_ != &local_2a0) {
          operator_delete((void *)local_2b0._0_8_,
                          CONCAT17(local_2a0._M_local_buf[7],
                                   CONCAT16(local_2a0._M_local_buf[6],
                                            CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                     CONCAT22(local_2a0._M_allocated_capacity._2_2_,
                                                              local_2a0._M_allocated_capacity._0_2_)
                                                    ))) + 1);
        }
        if (bVar30) {
          iVar13 = *(int *)((long)&p_Var20[0x17]._M_parent + 4);
          if (iVar13 != 1) {
            if (iVar13 == 0) {
              (local_5a8->fallback)._value_empty = true;
              AttrMetas::operator=(local_5b0,(AttrMetas *)(p_Var20 + 7));
              __v = &local_5d8;
LAB_002371c4:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_550,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
              local_628 = (undefined1  [8])((ulong)local_628 & 0xffffffff00000000);
            }
            else {
              warn = (string *)0x25;
              ::std::__cxx11::string::_M_replace((ulong)&local_620,0,(char *)local_618,0x3bcc94);
              local_628._0_4_ = 8;
            }
            goto LAB_002371d1;
          }
          if (p_Var20[5]._M_left == p_Var20[5]._M_parent) {
            if (p_Var20[4]._M_right == (_Base_ptr)0x0) {
              bVar29 = false;
            }
            else {
              iVar13 = (**(code **)p_Var20[4]._M_right)();
              bVar29 = iVar13 == 4;
            }
            if ((bVar29) || ((p_Var20[5]._M_color & _S_black) != _S_red)) {
              (local_5a8->fallback)._blocked = true;
            }
          }
          if (((char)p_Var20[5]._M_color == _S_red) &&
             ((((p_Var20[4]._M_right != (_Base_ptr)0x0 &&
                (iVar13 = (**(code **)p_Var20[4]._M_right)(), iVar13 == 0)) ||
               ((p_Var20[4]._M_right != (_Base_ptr)0x0 &&
                (iVar13 = (**(code **)p_Var20[4]._M_right)(), iVar13 == 1)))) &&
              (p_Var20[5]._M_left == p_Var20[5]._M_parent)))) {
            bVar29 = true;
            bVar30 = false;
          }
          else {
            local_4a8[0x20] = Varying;
            local_4a8._33_7_ = 0;
            local_4a8[0x28] = 0;
            local_4a8._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_4a8[0x18] = '\0';
            local_4a8._25_7_ = 0;
            local_4a8._8_4_ = 0;
            local_4a8._12_2_ = 0;
            local_4a8._0_4_ = Success;
            local_4a8._4_2_ = 0;
            local_4a8._6_2_ = 0;
            bVar29 = primvar::PrimVar::is_valid((PrimVar *)&p_Var20[4]._M_parent);
            if (bVar29) {
              if (((char)p_Var20[5]._M_color == _S_red) &&
                 (((p_Var20[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar13 = (**(code **)p_Var20[4]._M_right)(), iVar13 == 0)) ||
                  ((p_Var20[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar13 = (**(code **)p_Var20[4]._M_right)(), iVar13 == 1)))))) {
                cVar12 = '\0';
              }
              else {
                primvar::PrimVar::get_value<std::array<float,3ul>>
                          (&local_560,(PrimVar *)&p_Var20[4]._M_parent);
                cVar12 = local_560.has_value_;
                if (local_560.has_value_ == true) {
                  local_4b8.contained._7_4_ = local_560.contained._8_4_;
                  local_4b8._3_1_ = SUB81(local_560.contained._0_8_,0);
                  local_4b8.contained._0_7_ = (undefined7)((ulong)local_560.contained._0_8_ >> 8);
                  local_4a8._0_4_ = (undefined4)local_560.contained._0_8_;
                  local_4a8._4_2_ = (undefined2)((ulong)local_560.contained._0_8_ >> 0x20);
                  local_4a8._6_2_ = (undefined2)((ulong)local_560.contained._0_8_ >> 0x30);
                  local_4a8._8_4_ = local_560.contained._8_4_;
                  local_4a8._12_2_ = 1;
                }
              }
              if (p_Var20[5]._M_left == p_Var20[5]._M_parent) {
                if (cVar12 == '\0') goto LAB_00236e76;
              }
              else {
                lVar25 = 0;
                uVar22 = 0;
                do {
                  if ((char)p_Var20[6]._M_color == _S_black) {
                    tinyusdz::value::TimeSamples::update((TimeSamples *)&p_Var20[5]._M_parent);
                  }
                  p_Var28 = p_Var20[5]._M_parent;
                  if (*(char *)((long)&p_Var28[1]._M_color + lVar25) == '\x01') {
                    TypedTimeSamples<std::array<float,_3UL>_>::add_blocked_sample
                              ((TypedTimeSamples<std::array<float,_3UL>_> *)(local_4a8 + 0x10),
                               *(double *)((long)&p_Var28->_M_color + lVar25));
                  }
                  else {
                    tinyusdz::value::Value::get_value<std::array<float,3ul>>
                              (&local_4b8,(Value *)((long)&p_Var28->_M_parent + lVar25),false);
                    bVar29 = local_4b8.has_value_;
                    local_560.has_value_ = local_4b8.has_value_;
                    if (local_4b8.has_value_ == true) {
                      local_560.contained._8_4_ =
                           CONCAT13(local_4b8.contained._11_1_,local_4b8.contained._8_3_);
                      local_560.contained._0_8_ =
                           CONCAT17(local_4b8.contained._7_1_,local_4b8.contained._0_7_);
                      TypedTimeSamples<std::array<float,_3UL>_>::add_sample
                                ((TypedTimeSamples<std::array<float,_3UL>_> *)(local_4a8 + 0x10),
                                 *(double *)((long)&p_Var28->_M_color + lVar25),
                                 (array<float,_3UL> *)&local_560.contained);
                    }
                    else {
                      uStack_599 = 0;
                      uStack_598 = 0;
                      uStack_593 = 0;
                      uStack_591 = 0;
                      uStack_590 = 0;
                      uStack_58b = 0;
                    }
                    if (bVar29 == false) goto LAB_00236e79;
                  }
                  uVar22 = uVar22 + 1;
                  lVar25 = lVar25 + 0x28;
                } while (uVar22 < (ulong)(((long)p_Var20[5]._M_left - (long)p_Var20[5]._M_parent >>
                                          3) * -0x3333333333333333));
              }
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4a8._16_8_;
              uStack_591 = (undefined1)local_4a8._8_4_;
              uStack_590 = (undefined5)
                           (CONCAT26(local_4a8._12_2_,CONCAT42(local_4a8._8_4_,local_4a8._6_2_)) >>
                           0x18);
              uStack_599 = (undefined1)local_4a8._0_4_;
              uStack_598 = (undefined5)(CONCAT24(local_4a8._4_2_,local_4a8._0_4_) >> 8);
              uStack_593 = local_4a8._6_2_;
              aVar26._1_7_ = local_4a8._25_7_;
              aVar26._0_1_ = local_4a8[0x18];
              pcVar23 = (pointer)CONCAT71(local_4a8._33_7_,local_4a8[0x20]);
              local_4a8._16_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_4a8[0x18] = '\0';
              local_4a8._25_7_ = 0;
              local_4a8[0x20] = Varying;
              local_4a8._33_7_ = 0;
              cVar12 = '\x01';
              uVar21 = local_4a8[0x28];
            }
            else {
LAB_00236e76:
              uStack_599 = 0;
              uStack_598 = 0;
              uStack_593 = 0;
              uStack_591 = 0;
              uStack_590 = 0;
              uStack_58b = 0;
LAB_00236e79:
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              aVar26 = (anon_struct_8_0_00000001_for___align)0x0;
              pcVar23 = (pointer)0x0;
              uVar21 = 0;
              cVar12 = '\0';
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4a8._16_8_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete((void *)local_4a8._16_8_,
                              CONCAT71(local_4a8._33_7_,local_4a8[0x20]) - local_4a8._16_8_);
            }
            err = local_580;
            local_2b0[0] = cVar12;
            if (cVar12 != '\0') {
              local_2a0._M_allocated_capacity._0_2_ =
                   (undefined2)(CONCAT53(uStack_590,CONCAT12(uStack_591,uStack_593)) >> 0x10);
              local_2a0._M_allocated_capacity._2_2_ = (undefined2)((uint5)uStack_590 >> 8);
              local_2a0._M_allocated_capacity._4_2_ = (undefined2)((uint5)uStack_590 >> 0x18);
              local_2b0._8_4_ = (undefined4)CONCAT51(uStack_598,uStack_599);
              local_2b0._12_2_ = (undefined2)((uint5)uStack_598 >> 0x18);
              local_2b0._14_2_ = uStack_593;
              local_290[0x10] = uVar21;
              local_2a0._8_8_ = pbVar27;
              local_290._0_8_ = aVar26;
              local_290._8_8_ = pcVar23;
            }
            if (cVar12 == '\x01') {
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,3ul>>>::
              operator=(local_4e0,(Animatable<std::array<float,_3UL>_> *)(local_2b0 + 8));
            }
            else {
              local_628._0_4_ = 8;
              warn = (string *)0x55;
              ::std::__cxx11::string::_M_replace((ulong)&local_620,0,(char *)local_618,0x3bcf62);
            }
            if ((local_2b0[0] == '\x01') &&
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              operator_delete((void *)local_2a0._8_8_,local_290._8_8_ - local_2a0._8_8_);
            }
            if (cVar12 != '\0') {
              AttrMetas::operator=(local_5b0,(AttrMetas *)(p_Var20 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_550,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_5d8);
              local_628 = (undefined1  [8])((ulong)local_628 & 0xffffffff00000000);
            }
            bVar30 = true;
            bVar29 = false;
          }
          if (bVar29) {
            if (p_Var20[6]._M_left != p_Var20[6]._M_parent) {
              AttrMetas::operator=(local_5b0,(AttrMetas *)(p_Var20 + 7));
              __v = (string *)&local_520;
              goto LAB_002371c4;
            }
            goto LAB_002371d1;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
            operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
          }
          if ((bVar30) ||
             (pcVar23 = (pointer)auStack_610._0_8_, _Var24._M_p = local_620._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._M_p ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_610))
          goto LAB_002371ed;
        }
        else {
          local_628._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0._M_local_buf,local_5d8._M_dataplus._M_p,
                               local_5d8._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," expects type `",0xf);
          pcVar14 = local_4a8 + 0x10;
          local_4a8._0_4_ = SUB84(pcVar14,0);
          local_4a8._4_2_ = (undefined2)((ulong)pcVar14 >> 0x20);
          local_4a8._6_2_ = (undefined2)((ulong)pcVar14 >> 0x30);
          local_4a8._8_4_ = 6;
          local_4a8._12_2_ = 0;
          local_4a8._14_2_ = 0;
          local_4a8._16_7_ = 0x3374616f6c66;
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar14,6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"` but defined as type `",0x17);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(char *)local_600._0_8_,local_600._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"`",1);
          pcVar5 = (char *)CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_));
          if (pcVar5 != pcVar14) {
            operator_delete(pcVar5,(ulong)(local_4a8._16_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_620,(string *)local_4a8);
          puVar4 = (undefined1 *)CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_))
          ;
          if (puVar4 != local_4a8 + 0x10) {
            operator_delete(puVar4,(ulong)(local_4a8._16_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&p_Stack_230);
LAB_002371d1:
          pcVar23 = (pointer)local_5f0._0_8_;
          _Var24._M_p = (pointer)local_600._0_8_;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0)
          goto LAB_002371ed;
        }
        operator_delete(_Var24._M_p,(ulong)(pcVar23 + 1));
      }
LAB_002371ed:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
      }
      iVar13 = 0;
      if (((ulong)local_628 & 0xfffffffd) == 0) {
        iVar13 = 3;
LAB_00237464:
        bVar29 = false;
      }
      else {
        bVar29 = true;
        if (local_628._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x10b9);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
          local_600._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_600,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_4a8,(fmt *)local_600,(string *)"inputs:fallback",
                     (char (*) [16])&local_620,warn);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,
                               (char *)CONCAT26(local_4a8._6_2_,
                                                CONCAT24(local_4a8._4_2_,local_4a8._0_4_)),
                               CONCAT26(local_4a8._14_2_,CONCAT24(local_4a8._12_2_,local_4a8._8_4_))
                              );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
          puVar6 = (undefined1 *)CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_))
          ;
          puVar4 = local_4a8 + 0x10;
          if (puVar6 != puVar4) {
            operator_delete(puVar6,(ulong)(local_4a8._16_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
            operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar16 = (long *)::std::__cxx11::string::_M_append
                                        (local_600,(ulong)(err->_M_dataplus)._M_p);
            local_4a8._0_4_ = SUB84(puVar4,0);
            local_4a8._4_2_ = (undefined2)((ulong)puVar4 >> 0x20);
            local_4a8._6_2_ = (undefined2)((ulong)puVar4 >> 0x30);
            lVar25 = *plVar16;
            plVar17 = plVar16 + 2;
            if ((long *)lVar25 == plVar17) {
              local_4a8._16_8_ = *plVar17;
              local_4a8[0x18] = (undefined1)plVar16[3];
              local_4a8._25_7_ = (undefined7)((ulong)plVar16[3] >> 8);
            }
            else {
              local_4a8._0_4_ = (undefined4)lVar25;
              local_4a8._4_2_ = (undefined2)((ulong)lVar25 >> 0x20);
              local_4a8._6_2_ = (undefined2)((ulong)lVar25 >> 0x30);
              local_4a8._16_8_ = *plVar17;
            }
            lVar25 = plVar16[1];
            local_4a8._8_4_ = (undefined4)lVar25;
            local_4a8._12_2_ = (undefined2)((ulong)lVar25 >> 0x20);
            local_4a8._14_2_ = (undefined2)((ulong)lVar25 >> 0x30);
            *plVar16 = (long)plVar17;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
            puVar6 = (undefined1 *)
                     CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_));
            if (puVar6 != puVar4) {
              operator_delete(puVar6,(ulong)(local_4a8._16_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
              operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
          iVar13 = 1;
          goto LAB_00237464;
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_610) {
        operator_delete(local_620._M_p,(ulong)(auStack_610._0_8_ + 1));
      }
      if (bVar29) {
        local_568 = p_Var20 + 1;
        iVar13 = ::std::__cxx11::string::compare((char *)local_568);
        if (iVar13 == 0) {
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,"inputs:varname","");
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_550,&local_2d0);
          bVar29 = (_Rb_tree_header *)cVar18._M_node == &local_550._M_impl.super__Rb_tree_header;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar29 = false;
        }
        if (bVar29) {
          local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
          local_2b0._8_4_ = local_2b0._8_4_ & 0xffffff00;
          local_2b0._12_2_ = 0;
          local_2b0._14_2_ = 0;
          local_2a0._M_allocated_capacity._0_2_ = 0;
          local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
          local_220 = (pointer)0x0;
          local_218 = 0;
          local_100.has_value_ = false;
          local_100._1_3_ = 0;
          local_100.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          auStack_f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_128.contained._16_8_ = 0;
          local_128.contained._24_8_ = 0;
          auStack_f8._16_4_ = 0;
          auStack_f8._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          sStack_268._8_1_ = 0;
          local_290._32_8_ = 0;
          sStack_268.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_290._16_8_ = 0;
          local_290._24_8_ = 0;
          local_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_290._8_8_ = (pointer)0x0;
          local_228 = 0;
          local_238 = (pointer)0x0;
          p_Stack_230 = (_Base_ptr)0x0;
          local_248 = (pointer)0x0;
          pSStack_240 = (pointer)0x0;
          sStack_268._16_8_ = (vtable_type *)0x0;
          sStack_268._24_8_ = 0;
          auStack_1f8[8] = 0;
          local_200._0_1_ = false;
          local_200._1_1_ = (storage_t<bool>)0x0;
          local_200._2_6_ = 0;
          auStack_1f8._0_8_ = 0;
          local_210.has_value_ = false;
          local_210._1_3_ = 0;
          local_210.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          oStack_208.has_value_ = false;
          oStack_208._1_3_ = 0;
          oStack_208.contained = (storage_t<unsigned_int>)0x0;
          aaStack_1e0[1]._8_1_ = 0;
          aaStack_1e0[0]._8_8_ = 0;
          aaStack_1e0[1]._0_8_ = 0;
          auStack_1f8._16_8_ = 0;
          aaStack_1e0[0]._M_allocated_capacity = 0;
          local_1a0._M_local_buf[0] = '\0';
          local_1c0._16_8_ = 0;
          local_1c0._24_8_ = 0;
          local_1c0._0_8_ = 0;
          local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170[8] = 0;
          aStack_180._8_8_ = 0;
          auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_188 = 0;
          aStack_180._M_allocated_capacity = 0;
          local_1a0._8_8_ = 0;
          uStack_190 = 0;
          auStack_148[8] = '\0';
          local_150._M_p = (pointer)0x0;
          auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170._16_8_ = 0;
          auStack_170._24_8_ = 0;
          local_128.contained._8_1_ = 0;
          local_128.has_value_ = false;
          local_128._1_7_ = 0;
          local_128.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_148._16_8_ = 0;
          auStack_148._24_8_ = 0;
          auStack_f8._32_8_ = auStack_f8 + 0x10;
          auStack_c0[0x18] = 0;
          auStack_c0._8_8_ = 0;
          auStack_c0._16_8_ = 0;
          auStack_f8._48_8_ = 0;
          auStack_c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_a0[0x10] = 0;
          local_a0._17_8_ = 0;
          local_a0._0_8_ = 0;
          local_a0[8] = 0;
          local_a0._9_7_ = 0;
          bStack_40 = false;
          uStack_3f = 0;
          auStack_78._40_8_ = 0;
          auStack_78[0x30] = _S_red;
          auStack_78._49_7_ = 0;
          auStack_78._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_78._32_8_ = 0;
          auStack_78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_78._16_8_ = 0;
          local_80[0] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[1] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[2] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[3] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[4] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[5] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[6] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[7] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          auStack_78._0_8_ = 0;
          local_2f0._0_8_ = (long)local_2f0 + 0x10;
          auStack_f8._40_8_ = auStack_f8._32_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f0,*(long *)(p_Var20 + 1),
                     (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
          puVar4 = local_4a8 + 0x10;
          local_4a8._0_4_ = SUB84(puVar4,0);
          uVar9 = local_4a8._0_4_;
          local_4a8._4_2_ = (undefined2)((ulong)puVar4 >> 0x20);
          uVar10 = local_4a8._4_2_;
          local_4a8._6_2_ = (undefined2)((ulong)puVar4 >> 0x30);
          uVar11 = local_4a8._6_2_;
          warn = (string *)local_4a8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)local_628,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_550,(string *)local_2f0,local_5b8,warn,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
          puVar6 = (undefined1 *)CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_))
          ;
          if (puVar6 != puVar4) {
            operator_delete(puVar6,(ulong)(local_4a8._16_8_ + 1));
          }
          if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
            operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
          }
          if (local_628._0_4_ == TypeMismatch) {
            local_310._0_8_ = local_300;
            ::std::__cxx11::string::_M_construct<char*>
                      (local_310,*(long *)(p_Var20 + 1),
                       (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
            warn = (string *)local_4a8;
            local_4a8._0_4_ = uVar9;
            local_4a8._4_2_ = uVar10;
            local_4a8._6_2_ = uVar11;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            args = local_5b8;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)local_600,(_anonymous_namespace_ *)&local_550,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310,(string *)local_5b8,(Property *)warn,(string *)local_570,
                       in_stack_fffffffffffff9c8);
            puVar6 = (undefined1 *)
                     CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_));
            if (puVar6 != puVar4) {
              operator_delete(puVar6,(ulong)(local_4a8._16_8_ + 1));
            }
            paVar2 = &local_5d8.field_2;
            if ((undefined8 *)local_310._0_8_ != local_300) {
              operator_delete((void *)local_310._0_8_,local_300[0] + 1);
            }
            if (local_600._0_4_ == 0) {
              iVar13 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4a8,0x10d2);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_5a0 = SUB87(&uStack_590,0);
              uStack_599 = (undefined1)((ulong)&uStack_590 >> 0x38);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5a0,"Faied to parse inputs:varname: {}","");
              fmt::format<std::__cxx11::string>
                        (&local_5d8,(fmt *)&local_5a0,(string *)(local_600 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4a8,local_5d8._M_dataplus._M_p,
                                   local_5d8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5d8._M_dataplus._M_p != paVar2) {
                operator_delete(local_5d8._M_dataplus._M_p,
                                local_5d8.field_2._M_allocated_capacity + 1);
              }
              if ((undefined5 *)CONCAT17(uStack_599,local_5a0) != &uStack_590) {
                operator_delete((undefined5 *)CONCAT17(uStack_599,local_5a0),
                                CONCAT17(uStack_589,CONCAT25(uStack_58b,uStack_590)) + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar17 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_5a0,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar17 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar17 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_5d8.field_2._M_allocated_capacity = *psVar1;
                  local_5d8.field_2._8_8_ = plVar17[3];
                  local_5d8._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_5d8.field_2._M_allocated_capacity = *psVar1;
                  local_5d8._M_dataplus._M_p = (pointer)*plVar17;
                }
                local_5d8._M_string_length = plVar17[1];
                *plVar17 = (long)psVar1;
                plVar17[1] = 0;
                *(undefined1 *)(plVar17 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_5d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5d8._M_dataplus._M_p != paVar2) {
                  operator_delete(local_5d8._M_dataplus._M_p,
                                  local_5d8.field_2._M_allocated_capacity + 1);
                }
                if ((undefined5 *)CONCAT17(uStack_599,local_5a0) != &uStack_590) {
                  operator_delete((undefined5 *)CONCAT17(uStack_599,local_5a0),
                                  CONCAT17(uStack_589,CONCAT25(uStack_58b,uStack_590)) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
              ::std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x70));
              iVar13 = 1;
            }
            if ((undefined1 *)local_600._8_8_ != local_5f0 + 8) {
              operator_delete((void *)local_600._8_8_,local_5f0._8_8_ + 1);
            }
          }
          else {
            iVar13 = 0;
            if (local_628._0_4_ == Success) {
              bVar29 = ConvertTokenAttributeToStringAttribute
                                 ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                  local_2b0,local_570);
              iVar13 = 3;
              if (!bVar29) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"():",3);
                poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4a8,0x10c0);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,
                           "Failed to convert inputs:varname token type to string type.",0x3b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"\n",1);
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar17 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_5d8,(ulong)(err->_M_dataplus)._M_p);
                  pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (plVar17 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar17
                      == pbVar27) {
                    local_5f0._0_8_ = (pbVar27->_M_dataplus)._M_p;
                    local_5f0._8_8_ = plVar17[3];
                    local_600._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5f0;
                  }
                  else {
                    local_5f0._0_8_ = (pbVar27->_M_dataplus)._M_p;
                    local_600._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *plVar17;
                  }
                  local_600._8_8_ = plVar17[1];
                  *plVar17 = (long)pbVar27;
                  plVar17[1] = 0;
                  *(undefined1 *)(plVar17 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_600);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_600._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0
                     ) {
                    operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                    operator_delete(local_5d8._M_dataplus._M_p,
                                    local_5d8.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
                ::std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x70));
                iVar13 = 1;
              }
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_610) {
            operator_delete(local_620._M_p,(ulong)(auStack_610._0_8_ + 1));
          }
          if (local_a0[0x18] == '\x01') {
            nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
            destruct_value(local_80);
          }
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
          AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
          if (iVar13 != 0) goto LAB_0023835b;
        }
        local_330._0_8_ = local_320;
        ::std::__cxx11::string::_M_construct<char*>
                  (local_330,*(long *)(p_Var20 + 1),
                   (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
        local_2b0._0_8_ = &local_2a0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"outputs:result","");
        warn = (string *)local_2b0;
        (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,3ul>>
                  ((ParseResult *)local_4a8,(_anonymous_namespace_ *)&local_550,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_330,(string *)local_5b8,(Property *)local_2b0,local_4c8,
                   (TypedTerminalAttribute<std::array<float,_3UL>_> *)in_stack_fffffffffffff9c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._0_8_ != &local_2a0) {
          operator_delete((void *)local_2b0._0_8_,
                          CONCAT17(local_2a0._M_local_buf[7],
                                   CONCAT16(local_2a0._M_local_buf[6],
                                            CONCAT24(local_2a0._M_allocated_capacity._4_2_,
                                                     CONCAT22(local_2a0._M_allocated_capacity._2_2_,
                                                              local_2a0._M_allocated_capacity._0_2_)
                                                    ))) + 1);
        }
        if ((long *)local_330._0_8_ != local_320) {
          operator_delete((void *)local_330._0_8_,local_320[0] + 1);
        }
        p_Var28 = local_568;
        iVar13 = 0;
        if ((local_4a8._0_4_ & ~AlreadyProcessed) == Success) {
          iVar13 = 3;
LAB_00237fb0:
          bVar29 = false;
        }
        else {
          bVar29 = true;
          if (local_4a8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x10d8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
            local_600._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_600,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_628,(fmt *)local_600,(string *)"outputs:result",
                       (char (*) [15])(local_4a8 + 8),warn);
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_628,(long)local_620._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
            if (local_628 != (undefined1  [8])local_618) {
              operator_delete((void *)local_628,(ulong)((long)local_618 + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
              operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar16 = (long *)::std::__cxx11::string::_M_append
                                          (local_600,(ulong)(err->_M_dataplus)._M_p);
              plVar17 = plVar16 + 2;
              if ((long *)*plVar16 == plVar17) {
                local_618 = (undefined1  [8])*plVar17;
                auStack_610._0_8_ = plVar16[3];
                local_628 = (undefined1  [8])local_618;
              }
              else {
                local_618 = (undefined1  [8])*plVar17;
                local_628 = (undefined1  [8])*plVar16;
              }
              local_620._M_p = (pointer)plVar16[1];
              *plVar16 = (long)plVar17;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_628);
              if (local_628 != (undefined1  [8])local_618) {
                operator_delete((void *)local_628,(ulong)((long)local_618 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_600._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0) {
                operator_delete((void *)local_600._0_8_,(ulong)(local_5f0._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
            iVar13 = 1;
            goto LAB_00237fb0;
          }
        }
        puVar4 = (undefined1 *)CONCAT26(local_4a8._14_2_,CONCAT24(local_4a8._12_2_,local_4a8._8_4_))
        ;
        if (puVar4 != local_4a8 + 0x18) {
          operator_delete(puVar4,CONCAT71(local_4a8._25_7_,local_4a8[0x18]) + 1);
        }
        if (bVar29) {
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_550,(key_type *)p_Var28);
          p_Var3 = &local_550._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar18._M_node == p_Var3) {
            pmVar19 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[](local_4d8,(key_type *)p_Var28);
            ::std::__cxx11::string::_M_assign((string *)pmVar19);
            (pmVar19->_attrib)._varying_authored = (bool)p_Var20[3].field_0x4;
            (pmVar19->_attrib)._variability = p_Var20[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar19->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar19->_attrib)._var,(any *)&p_Var20[4]._M_parent);
            (pmVar19->_attrib)._var._blocked = SUB41(p_Var20[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&(pmVar19->_attrib)._var._ts,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var20[5]._M_parent);
            p_Var28 = local_568;
            (pmVar19->_attrib)._var._ts._dirty = SUB41(p_Var20[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar19->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var20[6]._M_parent);
            AttrMetas::operator=(&(pmVar19->_attrib)._metas,(AttrMetas *)(p_Var20 + 7));
            *(_Base_ptr *)&pmVar19->_listOpQual = p_Var20[0x17]._M_parent;
            (pmVar19->_rel).type = *(Type *)&p_Var20[0x17]._M_left;
            Path::operator=(&(pmVar19->_rel).targetPath,(Path *)&p_Var20[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar19->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var20[0x1e]._M_parent);
            (pmVar19->_rel).listOpQual = p_Var20[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar19->_rel)._metas,(AttrMetas *)&p_Var20[0x1f]._M_parent);
            (pmVar19->_rel)._varying_authored = *(bool *)&p_Var20[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar19->_prop_value_type_name);
            pmVar19->_has_custom = *(bool *)&p_Var20[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_550,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var28)
            ;
          }
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_550,(key_type *)p_Var28);
          iVar13 = 0;
          if ((_Rb_tree_header *)cVar18._M_node == p_Var3) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x10da);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4a8,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var28);
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,
                                 (char *)CONCAT26(local_4a8._6_2_,
                                                  CONCAT24(local_4a8._4_2_,local_4a8._0_4_)),
                                 CONCAT26(local_4a8._14_2_,
                                          CONCAT24(local_4a8._12_2_,local_4a8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
            puVar4 = (undefined1 *)
                     CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_));
            if (puVar4 != local_4a8 + 0x10) {
              operator_delete(puVar4,(ulong)(local_4a8._16_8_ + 1));
            }
            if (local_578 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar16 = (long *)::std::__cxx11::string::_M_append
                                          (local_628,(ulong)(err->_M_dataplus)._M_p);
              puVar4 = local_4a8 + 0x10;
              local_4a8._0_4_ = SUB84(puVar4,0);
              local_4a8._4_2_ = (undefined2)((ulong)puVar4 >> 0x20);
              local_4a8._6_2_ = (undefined2)((ulong)puVar4 >> 0x30);
              lVar25 = *plVar16;
              plVar17 = plVar16 + 2;
              if ((long *)lVar25 == plVar17) {
                local_4a8._16_8_ = *plVar17;
                local_4a8[0x18] = (undefined1)plVar16[3];
                local_4a8._25_7_ = (undefined7)((ulong)plVar16[3] >> 8);
              }
              else {
                local_4a8._0_4_ = (undefined4)lVar25;
                local_4a8._4_2_ = (undefined2)((ulong)lVar25 >> 0x20);
                local_4a8._6_2_ = (undefined2)((ulong)lVar25 >> 0x30);
                local_4a8._16_8_ = *plVar17;
              }
              lVar25 = plVar16[1];
              local_4a8._8_4_ = (undefined4)lVar25;
              local_4a8._12_2_ = (undefined2)((ulong)lVar25 >> 0x20);
              local_4a8._14_2_ = (undefined2)((ulong)lVar25 >> 0x30);
              *plVar16 = (long)plVar17;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_578,(string *)local_4a8);
              puVar6 = (undefined1 *)
                       CONCAT26(local_4a8._6_2_,CONCAT24(local_4a8._4_2_,local_4a8._0_4_));
              if (puVar6 != puVar4) {
                operator_delete(puVar6,(ulong)(local_4a8._16_8_ + 1));
              }
              if (local_628 != (undefined1  [8])local_618) {
                operator_delete((void *)local_628,(ulong)((long)local_618 + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
          }
        }
      }
LAB_0023835b:
      if ((iVar13 != 3) && (iVar13 != 0)) break;
      p_Var20 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      local_629 = p_Var20 == local_4c0;
    } while (!local_629);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_550,(_Link_type)local_550._M_impl.super__Rb_tree_header._M_header._M_parent);
  return local_629;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float3>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float3 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float3,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float3, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float3, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}